

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<float,unsigned_char>
          (BaseAppender *this,Vector *col,float input)

{
  uchar uVar1;
  
  uVar1 = Cast::Operation<float,unsigned_char>(input);
  col->data[(this->chunk).count] = uVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}